

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O0

int constructConnectVariableHeader
              (BUFFER_HANDLE ctrlPacket,MQTT_CLIENT_OPTIONS *mqttOptions,STRING_HANDLE trace_log)

{
  int iVar1;
  uchar *local_30;
  uint8_t *iterator;
  STRING_HANDLE pSStack_20;
  int result;
  STRING_HANDLE trace_log_local;
  MQTT_CLIENT_OPTIONS *mqttOptions_local;
  BUFFER_HANDLE ctrlPacket_local;
  
  iterator._4_4_ = 0;
  pSStack_20 = trace_log;
  trace_log_local = (STRING_HANDLE)mqttOptions;
  mqttOptions_local = (MQTT_CLIENT_OPTIONS *)ctrlPacket;
  iVar1 = BUFFER_enlarge(ctrlPacket,10);
  if (iVar1 == 0) {
    local_30 = BUFFER_u_char((BUFFER_HANDLE)mqttOptions_local);
    if (local_30 == (uchar *)0x0) {
      iterator._4_4_ = 0xd0;
    }
    else {
      if (pSStack_20 != (STRING_HANDLE)0x0) {
        STRING_sprintf(pSStack_20," | VER: %d | KEEPALIVE: %d | FLAGS:",4,
                       (ulong)*(ushort *)&trace_log_local[5].s);
      }
      byteutil_writeUTF(&local_30,"MQTT",4);
      byteutil_writeByte(&local_30,'\x04');
      byteutil_writeByte(&local_30,'\0');
      byteutil_writeInt(&local_30,*(uint16_t *)&trace_log_local[5].s);
      iterator._4_4_ = 0;
    }
  }
  else {
    iterator._4_4_ = 0xc9;
  }
  return iterator._4_4_;
}

Assistant:

static int constructConnectVariableHeader(BUFFER_HANDLE ctrlPacket, const MQTT_CLIENT_OPTIONS* mqttOptions, STRING_HANDLE trace_log)
{
    int result = 0;
    if (BUFFER_enlarge(ctrlPacket, CONNECT_VARIABLE_HEADER_SIZE) != 0)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint8_t* iterator = BUFFER_u_char(ctrlPacket);
        if (iterator == NULL)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (trace_log != NULL)
            {
                STRING_sprintf(trace_log, " | VER: %d | KEEPALIVE: %d | FLAGS:", PROTOCOL_NUMBER, mqttOptions->keepAliveInterval);
            }
            byteutil_writeUTF(&iterator, "MQTT", 4);
            byteutil_writeByte(&iterator, PROTOCOL_NUMBER);
            byteutil_writeByte(&iterator, 0); // Flags will be entered later
            byteutil_writeInt(&iterator, mqttOptions->keepAliveInterval);
            result = 0;
        }
    }
    return result;
}